

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakDetectorTest_OneAllocButNoLeak_TestShell::
~TEST_MemoryLeakDetectorTest_OneAllocButNoLeak_TestShell
          (TEST_MemoryLeakDetectorTest_OneAllocButNoLeak_TestShell *this)

{
  TEST_MemoryLeakDetectorTest_OneAllocButNoLeak_TestShell *this_local;
  
  ~TEST_MemoryLeakDetectorTest_OneAllocButNoLeak_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, OneAllocButNoLeak)
{
    char* mem = detector->allocMemory(testAllocator, 4);
    detector->deallocMemory(testAllocator, mem);
    detector->stopChecking();
    STRCMP_CONTAINS("No memory leaks", detector->report(mem_leak_period_checking));
    LONGS_EQUAL(1, testAllocator->alloc_called);
    LONGS_EQUAL(1, testAllocator->free_called);
}